

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink.h
# Opt level: O3

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex>::
set_color_mode_(ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex>
                *this,color_mode mode)

{
  undefined1 uVar1;
  int iVar2;
  char **ppcVar3;
  char *local_18;
  
  if (mode == always) {
    uVar1 = true;
  }
  else {
    if (mode != never) {
      if (mode != automatic) {
        return;
      }
      iVar2 = fileno((FILE *)this->target_file_);
      iVar2 = isatty(iVar2);
      if ((iVar2 != 0) && (local_18 = getenv("TERM"), local_18 != (char *)0x0)) {
        uVar1 = details::os::is_color_terminal()::result;
        if ((details::os::is_color_terminal()::result == '\0') &&
           (iVar2 = __cxa_guard_acquire(&details::os::is_color_terminal()::result),
           uVar1 = details::os::is_color_terminal()::result, iVar2 != 0)) {
          ppcVar3 = std::
                    __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_pred<spdlog::details::os::is_color_terminal()::_lambda(char_const*)_1_>>
                              (details::os::is_color_terminal()::Terms,
                               &std::
                                _Sp_counted_ptr_inplace<spdlog::sinks::basic_file_sink<std::mutex>,std::allocator<spdlog::sinks::basic_file_sink<std::mutex>>,(__gnu_cxx::_Lock_policy)2>
                                ::vtable,&local_18);
          details::os::is_color_terminal()::result =
               ppcVar3 !=
               (char **)&std::
                         _Sp_counted_ptr_inplace<spdlog::sinks::basic_file_sink<std::mutex>,std::allocator<spdlog::sinks::basic_file_sink<std::mutex>>,(__gnu_cxx::_Lock_policy)2>
                         ::vtable;
          __cxa_guard_release(&details::os::is_color_terminal()::result);
          uVar1 = details::os::is_color_terminal()::result;
        }
        goto LAB_00116b29;
      }
    }
    uVar1 = false;
  }
LAB_00116b29:
  this->should_do_colors_ = (bool)uVar1;
  return;
}

Assistant:

void set_color_mode_(color_mode mode)
    {
        switch (mode)
        {
        case color_mode::always:
            should_do_colors_ = true;
            break;
        case color_mode::automatic:
            should_do_colors_ = details::os::in_terminal(target_file_) && details::os::is_color_terminal();
            break;
        case color_mode::never:
            should_do_colors_ = false;
            break;
        }
    }